

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O0

int establish_server_connection(atom_server as,int do_fallback)

{
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  int in_ESI;
  long in_RDI;
  sockaddr_in sock_addr;
  char ping_char;
  int delay_value;
  SOCKET sock;
  sa_family_t sVar5;
  undefined2 in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined1 local_1d;
  undefined4 local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_1c = 1;
  local_1d = 0;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (atom_server_verbose == -1) {
    pcVar3 = getenv("ATOM_SERVER_VERBOSE");
    atom_server_verbose = (int)(pcVar3 != (char *)0x0);
  }
  if (*(int *)(local_10 + 4) == -2) {
    return 0;
  }
  if ((*(int *)(local_10 + 4) == -1) ||
     (sVar4 = write(*(int *)(local_10 + 4),&local_1d,1), sVar4 != 1)) {
    fprintf(_stderr,"Establish server connection, write failed, creating socket\n");
    local_18 = socket(2,1,0);
    if (local_18 < 0) {
      fprintf(_stderr,
              "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n"
             );
      return 0;
    }
    sVar5 = 2;
    fprintf(_stderr,"Establish server connection, fill_host_addr\n");
    iVar2 = fill_hostaddr(in_stack_ffffffffffffffd8,
                          (char *)CONCAT44(in_stack_ffffffffffffffd4,
                                           CONCAT22(in_stack_ffffffffffffffd2,sVar5)));
    if (iVar2 == 0) {
      fprintf(_stderr,"Unknown Host \"%s\" specified as ATL atom server.\n",atom_server_host);
      *(undefined4 *)(local_10 + 4) = 0xfffffffe;
      return 0;
    }
    uVar1 = htons(0x115d);
    if (atom_server_verbose != 0) {
      printf("Trying connection to atom server on %s ...  ",atom_server_host);
    }
    iVar2 = connect(local_18,(sockaddr *)&stack0xffffffffffffffd0,0x10);
    if (iVar2 < 0) {
      if (atom_server_verbose != 0) {
        printf("failed\n");
      }
      if (local_14 == 0) {
        return 0;
      }
      local_18 = socket(2,1,0);
      if (local_18 < 0) {
        fprintf(_stderr,
                "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n"
               );
        return 0;
      }
      atom_server_host = "atomhost.cercs.gatech.edu";
      iVar2 = fill_hostaddr(in_stack_ffffffffffffffd8,
                            (char *)CONCAT44(in_stack_ffffffffffffffd4,CONCAT22(uVar1,2)));
      if (iVar2 == 0) {
        fprintf(_stderr,"Unknown Host \"%s\" specified as ATL atom server.\n",atom_server_host);
        *(undefined4 *)(local_10 + 4) = 0xfffffffe;
        return 0;
      }
      htons(0x115d);
      if (atom_server_verbose != 0) {
        printf("Trying fallback connection to atom server on %s ...  ",atom_server_host);
      }
      iVar2 = connect(local_18,(sockaddr *)&stack0xffffffffffffffd0,0x10);
      if (iVar2 < 0) {
        fprintf(_stderr,"Failed to connect to primary or fallback atom servers.\n");
        *(undefined4 *)(local_10 + 4) = 0xfffffffe;
        return 0;
      }
    }
    if (atom_server_verbose != 0) {
      printf("succeeded\n");
    }
    setsockopt(local_18,6,1,&local_1c,4);
    *(int *)(local_10 + 4) = local_18;
  }
  return 1;
}

Assistant:

static int
establish_server_connection(atom_server as, int do_fallback)
{
    SOCKET sock;
    int delay_value = 1;
    char ping_char = 0;

    if (atom_server_verbose == -1) {
	if (getenv("ATOM_SERVER_VERBOSE") == NULL) {
	    atom_server_verbose = 0;
	} else {
	    atom_server_verbose = 1;
	}
    }
    if (as->tcp_fd == -2) return 0;
    if ((as->tcp_fd == -1) || 
	(write(as->tcp_fd, &ping_char, 1) != 1)) {
	/* reestablish connection, name_str is the machine name */
	struct sockaddr_in sock_addr;

	fprintf(stderr, "Establish server connection, write failed, creating socket\n");
	if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0) {
	    fprintf(stderr, "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n");
	    return 0;
	}
	
	sock_addr.sin_family = AF_INET;
		
	fprintf(stderr, "Establish server connection, fill_host_addr\n");
	if (fill_hostaddr(&sock_addr.sin_addr, atom_server_host) == 0) {
	    fprintf(stderr, "Unknown Host \"%s\" specified as ATL atom server.\n",
		    atom_server_host);
	    as->tcp_fd = -2;
	    return 0;
	}
	sock_addr.sin_port = htons(TCP_PORT);

	if (atom_server_verbose) {
	    printf("Trying connection to atom server on %s ...  ",
		   atom_server_host);
	}
	if (connect(sock, (struct sockaddr *) &sock_addr,
		    sizeof sock_addr) < 0) {

	    if (atom_server_verbose) {
		printf("failed\n");
	    }
	    if (!do_fallback) return 0;

	    /* fallback */
	    if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0) {
		fprintf(stderr, "Failed to create socket for ATL atom server connection.  Not enough File Descriptors?\n");
	       return 0;
	    }
	    atom_server_host = "atomhost.cercs.gatech.edu";
	    sock_addr.sin_family = AF_INET;
	    if (fill_hostaddr(&sock_addr.sin_addr, atom_server_host) == 0){
		fprintf(stderr, "Unknown Host \"%s\" specified as ATL atom server.\n",
			atom_server_host);
		as->tcp_fd = -2;
		return 0;
	    }
	    sock_addr.sin_port = htons(TCP_PORT);
	    if (atom_server_verbose) {
		printf("Trying fallback connection to atom server on %s ...  ",
		       atom_server_host);
	    }
	    if (connect(sock, (struct sockaddr *) &sock_addr,
			sizeof sock_addr) < 0) {
		fprintf(stderr, "Failed to connect to primary or fallback atom servers.\n");
		as->tcp_fd = -2;
	        return 0;
	    }
	}
	if (atom_server_verbose) {
	    printf("succeeded\n");
	}
	setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char *) &delay_value,
		   sizeof(delay_value));
	as->tcp_fd = sock;
	/* 
	 * ignore SIGPIPE's  (these pop up when ports die.  we catch the 
	 * failed writes) 
	 */
#ifdef SIGPIPE
	signal(SIGPIPE, SIG_IGN);
#endif
    }
    return 1;
}